

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O1

void __thiscall
QMap<QTextList_*,_QTextMarkdownWriter::ListInfo>::detach
          (QMap<QTextList_*,_QTextMarkdownWriter::ListInfo> *this)

{
  _Rb_tree_header *p_Var1;
  QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>
  *t;
  
  if ((this->d).d.ptr !=
      (QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>
       *)0x0) {
    QtPrivate::
    QExplicitlySharedDataPointerV2<QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>_>
    ::detach(&this->d);
    return;
  }
  t = (QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>
       *)operator_new(0x38);
  (t->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i = 0;
  p_Var1 = &(t->m)._M_t._M_impl.super__Rb_tree_header;
  (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (t->m)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (t->m)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<QTextList_*,_QTextMarkdownWriter::ListInfo,_std::less<QTextList_*>,_std::allocator<std::pair<QTextList_*const,_QTextMarkdownWriter::ListInfo>_>_>_>_>
  ::reset(&this->d,t);
  return;
}

Assistant:

void detach()
    {
        if (d)
            d.detach();
        else
            d.reset(new MapData);
    }